

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Type.cxx
# Opt level: O3

void __thiscall Fl_Menu_Type::build_menu(Fl_Menu_Type *this)

{
  int *piVar1;
  Fl_Menu_ *this_00;
  Fl_Type *pFVar2;
  undefined1 auVar3 [16];
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  Fl_Menu_Item *pFVar7;
  Fl_Type *pFVar8;
  char *pcVar9;
  int *piVar10;
  int iVar11;
  ulong uVar12;
  Fl_Menu_Item_Type *i;
  Fl_Type *pFVar13;
  
  pFVar13 = (this->super_Fl_Widget_Type).super_Fl_Type.next;
  this_00 = (Fl_Menu_ *)(this->super_Fl_Widget_Type).o;
  if (pFVar13 != (Fl_Type *)0x0) {
    iVar11 = 0;
    do {
      if (pFVar13->level <= (this->super_Fl_Widget_Type).super_Fl_Type.level) break;
      iVar5 = (*pFVar13->_vptr_Fl_Type[0x16])(pFVar13);
      iVar11 = (iVar11 - (uint)(iVar5 == 0)) + 2;
      pFVar13 = pFVar13->next;
    } while (pFVar13 != (Fl_Type *)0x0);
    if (iVar11 != 0) {
      if (this->menusize <= iVar11) {
        if ((this->menusize != 0) && (this_00->menu_ != (Fl_Menu_Item *)0x0)) {
          operator_delete__(this_00->menu_);
        }
        this->menusize = iVar11 + 0xb;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = (long)(iVar11 + 0xb);
        uVar12 = 0xffffffffffffffff;
        if (SUB168(auVar3 * ZEXT816(0x38),8) == 0) {
          uVar12 = SUB168(auVar3 * ZEXT816(0x38),0);
        }
        pFVar7 = (Fl_Menu_Item *)operator_new__(uVar12);
        Fl_Menu_::menu(this_00,pFVar7);
      }
      pFVar13 = (this->super_Fl_Widget_Type).super_Fl_Type.next;
      if (pFVar13 != (Fl_Type *)0x0) {
        piVar1 = &(this->super_Fl_Widget_Type).super_Fl_Type.level;
        iVar11 = *piVar1 + 1;
        pFVar7 = this_00->menu_;
        do {
          if (pFVar13->level <= *piVar1) break;
          pFVar8 = pFVar13[1].prev;
          pFVar2 = pFVar8->parent;
          if (pFVar2 == (Fl_Type *)0x0) {
            pcVar9 = pFVar8->comment_;
            if (pcVar9 == (char *)0x0) {
              pcVar9 = "(nolabel)";
            }
            pFVar7->text = pcVar9;
            pFVar7->labeltype_ = *(uchar *)&pFVar8->prev;
          }
          else {
            (*pFVar2->_vptr_Fl_Type[6])(pFVar2,pFVar7);
            pFVar8 = pFVar13[1].prev;
          }
          pFVar7->shortcut_ = *(int *)&pFVar8[1]._vptr_Fl_Type;
          pFVar7->callback_ = (Fl_Callback *)0x0;
          pFVar7->user_data_ = pFVar13;
          iVar5 = Fl_Menu_Item_Type::flags((Fl_Menu_Item_Type *)pFVar13);
          pFVar7->flags = iVar5;
          pFVar2 = pFVar13[1].prev;
          uVar4 = *(undefined4 *)&pFVar2->field_0x4c;
          pFVar7->labelfont_ = pFVar2->level;
          pFVar7->labelsize_ = uVar4;
          pFVar7->labelcolor_ = *(Fl_Color *)&pFVar2->next;
          iVar6 = (*pFVar13->_vptr_Fl_Type[0x16])(pFVar13);
          iVar5 = iVar11;
          if (iVar6 != 0) {
            iVar5 = iVar11 + 1;
            *(byte *)&pFVar7->flags = (byte)pFVar7->flags | 0x40;
          }
          piVar10 = piVar1;
          if ((pFVar13->next != (Fl_Type *)0x0) &&
             (iVar11 = (*pFVar13->next->_vptr_Fl_Type[0x1e])(), iVar11 != 0)) {
            piVar10 = &pFVar13->next->level;
          }
          iVar11 = *piVar10;
          for (; pFVar7 = pFVar7 + 1, iVar11 < iVar5; iVar5 = iVar5 + -1) {
            pFVar7->text = (char *)0x0;
          }
          pFVar13 = pFVar13->next;
        } while (pFVar13 != (Fl_Type *)0x0);
      }
      goto LAB_0017eebe;
    }
  }
  if ((this->menusize != 0) && (this_00->menu_ != (Fl_Menu_Item *)0x0)) {
    operator_delete__(this_00->menu_);
  }
  Fl_Menu_::menu(this_00,(Fl_Menu_Item *)0x0);
  this->menusize = 0;
LAB_0017eebe:
  Fl_Widget::redraw((this->super_Fl_Widget_Type).o);
  return;
}

Assistant:

void Fl_Menu_Type::build_menu() {
  Fl_Menu_* w = (Fl_Menu_*)o;
  // count how many Fl_Menu_Item structures needed:
  int n = 0;
  Fl_Type* q;
  for (q = next; q && q->level > level; q = q->next) {
    if (q->is_parent()) n++; // space for null at end of submenu
    n++;
  }
  if (!n) {
    if (menusize) delete[] (Fl_Menu_Item*)(w->menu());
    w->menu(0);
    menusize = 0;
  } else {
    n++; // space for null at end of menu
    if (menusize<n) {
      if (menusize) delete[] (Fl_Menu_Item*)(w->menu());
      menusize = n+10;
      w->menu(new Fl_Menu_Item[menusize]);
    }
    // fill them all in:
    Fl_Menu_Item* m = (Fl_Menu_Item*)(w->menu());
    int lvl = level+1;
    for (q = next; q && q->level > level; q = q->next) {
      Fl_Menu_Item_Type* i = (Fl_Menu_Item_Type*)q;
      if (i->o->image()) i->o->image()->label(m);
      else {
        m->label(i->o->label() ? i->o->label() : "(nolabel)");
        m->labeltype(i->o->labeltype());
      }
      m->shortcut(((Fl_Button*)(i->o))->shortcut());
      m->callback(0,(void*)i);
      m->flags = i->flags();
      m->labelfont(i->o->labelfont());
      m->labelsize(i->o->labelsize());
      m->labelcolor(i->o->labelcolor());
      if (q->is_parent()) {lvl++; m->flags |= FL_SUBMENU;}
      m++;
      int l1 =
	(q->next && q->next->is_menu_item()) ? q->next->level : level;
      while (lvl > l1) {m->label(0); m++; lvl--;}
      lvl = l1;
    }
  }
  o->redraw();
}